

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Pubkey * cfd::core::Pubkey::CombinePubkey
                   (Pubkey *__return_storage_ptr__,Pubkey *pubkey,Pubkey *message_key)

{
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_stack_ffffffffffffff70;
  ByteData local_78;
  ByteData local_50;
  undefined1 local_38 [8];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> data_list;
  Pubkey *message_key_local;
  Pubkey *pubkey_local;
  
  data_list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &message_key->data_;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_38);
  GetData(&local_50,pubkey);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_38,&local_50
            );
  ByteData::~ByteData((ByteData *)0x44f378);
  GetData(&local_78,
          (Pubkey *)
          data_list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_38,&local_78
            );
  ByteData::~ByteData((ByteData *)0x44f39f);
  WallyUtil::CombinePubkeySecp256k1Ec
            ((ByteData *)&stack0xffffffffffffff70,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_38);
  Pubkey(__return_storage_ptr__,(ByteData *)&stack0xffffffffffffff70);
  ByteData::~ByteData((ByteData *)0x44f3d2);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (in_stack_ffffffffffffff70);
  return __return_storage_ptr__;
}

Assistant:

Pubkey Pubkey::CombinePubkey(const Pubkey &pubkey, const Pubkey &message_key) {
  std::vector<ByteData> data_list;
  data_list.push_back(pubkey.GetData());
  data_list.push_back(message_key.GetData());

  return Pubkey(WallyUtil::CombinePubkeySecp256k1Ec(data_list));
}